

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.c
# Opt level: O0

Card ** game_deckCreate(unsigned_long *cardsCount)

{
  Card **ppCVar1;
  long *in_RDI;
  Card **unaff_retaddr;
  Card **cards;
  uchar in_stack_00000087;
  
  ppCVar1 = cards_createDeck(in_stack_00000087);
  *in_RDI = (long)(int)((uint)(gConfig.game)->numDecks * 0x34);
  cards_shuffle(unaff_retaddr,(uchar)((ulong)in_RDI >> 0x38));
  return ppCVar1;
}

Assistant:

Card ** game_deckCreate(unsigned long * cardsCount)
{
	Card ** cards = cards_createDeck(gConfig.game->numDecks);
	*cardsCount = (gConfig.game->numDecks*52);

	cards_shuffle(cards, *cardsCount);

	return cards;
}